

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandListVkImpl.hpp
# Opt level: O3

void __thiscall Diligent::CommandListVkImpl::~CommandListVkImpl(CommandListVkImpl *this)

{
  IDeviceContext *pIVar1;
  string msg;
  string local_28;
  
  if ((this->m_pDeferredCtx).m_pObject != (IDeviceContext *)0x0 ||
      this->m_vkCmdBuff != (VkCommandBuffer)0x0) {
    FormatString<char[48]>
              (&local_28,(char (*) [48])"Destroying command list that was never executed");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"~CommandListVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/CommandListVkImpl.hpp"
               ,0x3c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    pIVar1 = (this->m_pDeferredCtx).m_pObject;
    if (pIVar1 != (IDeviceContext *)0x0) {
      (*(pIVar1->super_IObject)._vptr_IObject[2])();
      (this->m_pDeferredCtx).m_pObject = (IDeviceContext *)0x0;
    }
  }
  DeviceObjectBase<Diligent::ICommandList,_Diligent::RenderDeviceVkImpl,_Diligent::CommandListDesc>
  ::~DeviceObjectBase((DeviceObjectBase<Diligent::ICommandList,_Diligent::RenderDeviceVkImpl,_Diligent::CommandListDesc>
                       *)this);
  return;
}

Assistant:

~CommandListVkImpl()
    {
        VERIFY(m_vkCmdBuff == VK_NULL_HANDLE && !m_pDeferredCtx, "Destroying command list that was never executed");
    }